

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O2

void __thiscall RK_Individual::imprimePesos(RK_Individual *this)

{
  int i;
  long lVar1;
  
  printf("pesos {");
  for (lVar1 = 0; lVar1 < this->number_of_edges; lVar1 = lVar1 + 1) {
    printf("%.2f, ",this->weights[lVar1]);
  }
  puts("}");
  return;
}

Assistant:

void RK_Individual::imprimePesos(){
    printf("pesos {");
    for(int i=0; i<this->getNumEdges(); i++)
        printf("%.2f, ", this->weights[i]);
    printf("}\n");
}